

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_motion.c
# Opt level: O0

int generic_sad(uint8_t *ref,int ref_stride,uint8_t *dst,int dst_stride,int p_width,int p_height)

{
  int iVar1;
  int j;
  int i;
  int sad;
  int p_height_local;
  int p_width_local;
  int dst_stride_local;
  uint8_t *dst_local;
  int ref_stride_local;
  uint8_t *ref_local;
  
  sad = 0;
  for (i = 0; i < p_height; i = i + 1) {
    for (j = 0; j < p_width; j = j + 1) {
      iVar1 = (uint)dst[j + i * dst_stride] - (uint)ref[j + i * ref_stride];
      if (iVar1 < 1) {
        iVar1 = -iVar1;
      }
      sad = iVar1 + sad;
    }
  }
  return sad;
}

Assistant:

static inline int generic_sad(const uint8_t *const ref, int ref_stride,
                              const uint8_t *const dst, int dst_stride,
                              int p_width, int p_height) {
  // This function should only be called for patches smaller than
  // WARP_ERROR_BLOCK x WARP_ERROR_BLOCK. This keeps the number of pixels
  // small enough that we don't need a 64-bit accumulator
  assert(p_width <= WARP_ERROR_BLOCK && p_height <= WARP_ERROR_BLOCK);

  int sad = 0;
  for (int i = 0; i < p_height; ++i) {
    for (int j = 0; j < p_width; ++j) {
      sad += abs(dst[j + i * dst_stride] - ref[j + i * ref_stride]);
    }
  }
  return sad;
}